

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack4.h
# Opt level: O1

void ncnn::conv1x1s1_sgemm_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  int _h;
  uint uVar11;
  void *pvVar12;
  void *pvVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  int *piVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  undefined8 *puVar37;
  undefined1 (*pauVar38) [16];
  undefined8 *puVar39;
  undefined1 (*pauVar40) [16];
  int iVar41;
  long lVar42;
  uint uVar43;
  long lVar45;
  long lVar46;
  ulong uVar47;
  int iVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  Mat tmp;
  float zeros [4];
  Mat local_98;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong uVar44;
  
  uVar47 = (long)bottom_blob->h * (long)bottom_blob->w;
  _h = bottom_blob->c;
  uVar11 = top_blob->c;
  pvVar12 = _bias->data;
  uVar21 = (uint)uVar47;
  uVar34 = uVar21 + 3;
  if (-1 < (int)uVar21) {
    uVar34 = uVar21;
  }
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  Mat::create(&local_98,4,_h,
              (uVar21 - (((uint)(uVar47 >> 0x1f) & 1) + uVar21 & 0xfffffffe)) + ((int)uVar34 >> 2) +
              (int)(uVar21 - (uVar34 & 0xfffffffc)) / 2,bottom_blob->elemsize,bottom_blob->elempack,
              opt->workspace_allocator);
  uVar34 = (int)uVar21 >> 2;
  if (0 < (int)uVar34) {
    uVar35 = 0;
    do {
      if (0 < _h) {
        puVar37 = (undefined8 *)
                  (local_98.cstep * uVar35 *
                   CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) +
                  (long)local_98.data);
        puVar39 = (undefined8 *)(uVar35 * 0x40 + (long)bottom_blob->data);
        iVar41 = _h;
        do {
          uVar30 = puVar39[1];
          uVar31 = puVar39[2];
          uVar32 = puVar39[3];
          auVar10 = *(undefined1 (*) [32])(puVar39 + 4);
          *puVar37 = *puVar39;
          puVar37[1] = uVar30;
          puVar37[2] = uVar31;
          puVar37[3] = uVar32;
          *(undefined1 (*) [32])(puVar37 + 4) = auVar10;
          puVar39 = puVar39 + bottom_blob->cstep * 2;
          puVar37 = puVar37 + 8;
          iVar41 = iVar41 + -1;
        } while (iVar41 != 0);
      }
      uVar35 = uVar35 + 1;
    } while (uVar35 != uVar34);
  }
  if (((uVar47 >> 1 & 1) != 0) && (0 < _h)) {
    puVar37 = (undefined8 *)
              ((long)(int)uVar34 * local_98.cstep *
               CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) + (long)local_98.data
              );
    puVar39 = (undefined8 *)((long)(int)(uVar21 & 0xfffffffc) * 0x10 + (long)bottom_blob->data);
    iVar41 = _h;
    do {
      uVar30 = puVar39[1];
      uVar31 = puVar39[2];
      uVar32 = puVar39[3];
      *puVar37 = *puVar39;
      puVar37[1] = uVar30;
      puVar37[2] = uVar31;
      puVar37[3] = uVar32;
      puVar39 = puVar39 + bottom_blob->cstep * 2;
      puVar37 = puVar37 + 4;
      iVar41 = iVar41 + -1;
    } while (iVar41 != 0);
  }
  iVar41 = (uVar21 & 0xfffffffc) + ((uint)(uVar47 >> 1) & 1) * 2;
  if (iVar41 < (int)uVar21) {
    uVar35 = (ulong)iVar41;
    do {
      if (0 < _h) {
        uVar43 = (uint)uVar35;
        uVar34 = uVar43 + 3;
        if (-1 < (int)uVar43) {
          uVar34 = uVar43;
        }
        puVar37 = (undefined8 *)
                  ((long)(int)((int)(uVar43 - (uVar34 & 0xfffffffc)) / 2 +
                              ((int)uVar34 >> 2) +
                              (uVar43 - (((uint)(uVar35 >> 0x1f) & 1) + uVar43 & 0xfffffffe))) *
                   local_98.cstep * CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
                  + (long)local_98.data);
        puVar39 = (undefined8 *)(uVar35 * 0x10 + (long)bottom_blob->data);
        iVar41 = _h;
        do {
          uVar30 = puVar39[1];
          *puVar37 = *puVar39;
          puVar37[1] = uVar30;
          puVar37 = puVar37 + 2;
          puVar39 = puVar39 + bottom_blob->cstep * 2;
          iVar41 = iVar41 + -1;
        } while (iVar41 != 0);
      }
      uVar35 = uVar35 + 1;
    } while ((long)uVar35 < (long)uVar47);
  }
  if (0 < (int)uVar11) {
    uVar47 = 0;
    do {
      pauVar38 = (undefined1 (*) [16])
                 (top_blob->cstep * uVar47 * top_blob->elemsize + (long)top_blob->data);
      pauVar40 = (undefined1 (*) [16])(uVar47 * 0x10 + (long)pvVar12);
      if (pvVar12 == (void *)0x0) {
        pauVar40 = (undefined1 (*) [16])&local_48;
      }
      local_48 = 0;
      uStack_40 = 0;
      if ((int)uVar21 < 4) {
        uVar35 = 0;
      }
      else {
        lVar42 = 0;
        uVar44 = 0;
        do {
          auVar49 = *pauVar40;
          auVar55 = auVar49;
          auVar52 = auVar49;
          auVar54 = auVar49;
          if (0 < _h) {
            lVar45 = local_98.cstep *
                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) * lVar42;
            lVar46 = kernel->cstep * uVar47 * kernel->elemsize;
            pvVar13 = kernel->data;
            lVar36 = 0;
            iVar41 = _h;
            do {
              fVar5 = *(float *)((long)local_98.data + lVar36 + lVar45);
              fVar6 = *(float *)((long)local_98.data + lVar36 + lVar45 + 4);
              fVar7 = *(float *)((long)local_98.data + lVar36 + lVar45 + 8);
              fVar8 = *(float *)((long)local_98.data + lVar36 + lVar45 + 0xc);
              pfVar1 = (float *)((long)pvVar13 + lVar36 + lVar46);
              fVar22 = *pfVar1;
              fVar23 = pfVar1[1];
              fVar24 = pfVar1[2];
              fVar25 = pfVar1[3];
              pfVar1 = (float *)((long)pvVar13 + lVar36 + lVar46 + 0x10);
              fVar26 = *pfVar1;
              fVar27 = pfVar1[1];
              fVar28 = pfVar1[2];
              fVar29 = pfVar1[3];
              fVar14 = auVar49._4_4_;
              fVar15 = auVar49._8_4_;
              fVar16 = auVar49._12_4_;
              auVar53 = *(undefined1 (*) [16])((long)pvVar13 + lVar36 + lVar46 + 0x20);
              fVar17 = auVar53._0_4_;
              fVar18 = auVar53._4_4_;
              fVar19 = auVar53._8_4_;
              fVar20 = auVar53._12_4_;
              fVar9 = *(float *)((long)local_98.data + lVar36 + lVar45 + 0x10);
              auVar53 = *(undefined1 (*) [16])((long)pvVar13 + lVar36 + lVar46 + 0x30);
              fVar56 = auVar53._0_4_;
              fVar57 = auVar53._4_4_;
              fVar58 = auVar53._8_4_;
              fVar59 = auVar53._12_4_;
              auVar49._0_4_ =
                   fVar56 * fVar8 + fVar6 * fVar26 + fVar7 * fVar17 + fVar22 * fVar5 + auVar49._0_4_
              ;
              auVar49._4_4_ =
                   fVar57 * fVar8 + fVar6 * fVar27 + fVar7 * fVar18 + fVar23 * fVar5 + fVar14;
              auVar49._8_4_ =
                   fVar58 * fVar8 + fVar6 * fVar28 + fVar7 * fVar19 + fVar24 * fVar5 + fVar15;
              auVar49._12_4_ =
                   fVar59 * fVar8 + fVar6 * fVar29 + fVar7 * fVar20 + fVar25 * fVar5 + fVar16;
              fVar5 = *(float *)((long)local_98.data + lVar36 + lVar45 + 0x14);
              fVar14 = auVar55._4_4_;
              fVar15 = auVar55._8_4_;
              fVar16 = auVar55._12_4_;
              fVar6 = *(float *)((long)local_98.data + lVar36 + lVar45 + 0x18);
              fVar7 = *(float *)((long)local_98.data + lVar36 + lVar45 + 0x1c);
              fVar8 = *(float *)((long)local_98.data + lVar36 + lVar45 + 0x20);
              auVar55._0_4_ =
                   fVar56 * fVar7 + fVar5 * fVar26 + fVar6 * fVar17 + fVar9 * fVar22 + auVar55._0_4_
              ;
              auVar55._4_4_ =
                   fVar57 * fVar7 + fVar5 * fVar27 + fVar6 * fVar18 + fVar9 * fVar23 + fVar14;
              auVar55._8_4_ =
                   fVar58 * fVar7 + fVar5 * fVar28 + fVar6 * fVar19 + fVar9 * fVar24 + fVar15;
              auVar55._12_4_ =
                   fVar59 * fVar7 + fVar5 * fVar29 + fVar6 * fVar20 + fVar9 * fVar25 + fVar16;
              fVar5 = *(float *)((long)local_98.data + lVar36 + lVar45 + 0x24);
              fVar9 = auVar52._4_4_;
              fVar14 = auVar52._8_4_;
              fVar15 = auVar52._12_4_;
              fVar6 = *(float *)((long)local_98.data + lVar36 + lVar45 + 0x28);
              fVar7 = *(float *)((long)local_98.data + lVar36 + lVar45 + 0x2c);
              auVar52._0_4_ =
                   fVar56 * fVar7 + fVar5 * fVar26 + fVar6 * fVar17 + fVar8 * fVar22 + auVar52._0_4_
              ;
              auVar52._4_4_ =
                   fVar57 * fVar7 + fVar5 * fVar27 + fVar6 * fVar18 + fVar8 * fVar23 + fVar9;
              auVar52._8_4_ =
                   fVar58 * fVar7 + fVar5 * fVar28 + fVar6 * fVar19 + fVar8 * fVar24 + fVar14;
              auVar52._12_4_ =
                   fVar59 * fVar7 + fVar5 * fVar29 + fVar6 * fVar20 + fVar8 * fVar25 + fVar15;
              fVar5 = *(float *)((long)local_98.data + lVar36 + lVar45 + 0x30);
              fVar9 = auVar54._4_4_;
              fVar14 = auVar54._8_4_;
              fVar15 = auVar54._12_4_;
              fVar6 = *(float *)((long)local_98.data + lVar36 + lVar45 + 0x34);
              fVar7 = *(float *)((long)local_98.data + lVar36 + lVar45 + 0x38);
              fVar8 = *(float *)((long)local_98.data + lVar36 + lVar45 + 0x3c);
              auVar54._0_4_ =
                   fVar5 * fVar22 + auVar54._0_4_ + fVar26 * fVar6 + fVar17 * fVar7 + fVar56 * fVar8
              ;
              auVar54._4_4_ =
                   fVar5 * fVar23 + fVar9 + fVar27 * fVar6 + fVar18 * fVar7 + fVar57 * fVar8;
              auVar54._8_4_ =
                   fVar5 * fVar24 + fVar14 + fVar28 * fVar6 + fVar19 * fVar7 + fVar58 * fVar8;
              auVar54._12_4_ =
                   fVar5 * fVar25 + fVar15 + fVar29 * fVar6 + fVar20 * fVar7 + fVar59 * fVar8;
              lVar36 = lVar36 + 0x40;
              iVar41 = iVar41 + -1;
            } while (iVar41 != 0);
          }
          *pauVar38 = auVar49;
          pauVar38[1] = auVar55;
          pauVar38[2] = auVar52;
          pauVar38[3] = auVar54;
          pauVar38 = pauVar38 + 4;
          uVar35 = uVar44 + 4;
          lVar36 = uVar44 + 7;
          lVar42 = lVar42 + 1;
          uVar44 = uVar35;
        } while (lVar36 < (int)uVar21);
      }
      if ((int)((uint)uVar35 | 1) < (int)uVar21) {
        uVar34 = 0;
        do {
          auVar53 = *pauVar40;
          iVar41 = (int)uVar35;
          auVar50 = auVar53;
          if (0 < _h) {
            lVar36 = kernel->cstep * uVar47 * kernel->elemsize;
            pvVar13 = kernel->data;
            lVar42 = local_98.cstep *
                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) *
                     (ulong)((uVar34 & 1) + ((uint)(uVar35 >> 2) & 0x3fffffff));
            lVar45 = 0;
            iVar48 = _h;
            do {
              fVar5 = *(float *)((long)local_98.data + lVar45 + lVar42);
              fVar6 = *(float *)((long)local_98.data + lVar45 + lVar42 + 4);
              fVar7 = *(float *)((long)local_98.data + lVar45 + lVar42 + 8);
              fVar8 = *(float *)((long)local_98.data + lVar45 + lVar42 + 0xc);
              fVar9 = *(float *)((long)local_98.data + lVar45 + lVar42 + 0x10);
              fVar14 = *(float *)((long)local_98.data + lVar45 + lVar42 + 0x14);
              fVar15 = *(float *)((long)local_98.data + lVar45 + lVar42 + 0x18);
              fVar16 = *(float *)((long)local_98.data + lVar45 + lVar42 + 0x1c);
              auVar49 = *(undefined1 (*) [16])((long)pvVar13 + lVar45 * 2 + lVar36);
              auVar52 = *(undefined1 (*) [16])((long)pvVar13 + lVar45 * 2 + lVar36 + 0x10);
              auVar54 = *(undefined1 (*) [16])((long)pvVar13 + lVar45 * 2 + lVar36 + 0x20);
              auVar55 = *(undefined1 (*) [16])((long)pvVar13 + lVar45 * 2 + lVar36 + 0x30);
              fVar17 = auVar53._4_4_;
              fVar18 = auVar53._8_4_;
              fVar19 = auVar53._12_4_;
              auVar53._0_4_ =
                   auVar49._0_4_ * fVar5 + auVar53._0_4_ +
                   auVar52._0_4_ * fVar6 + auVar54._0_4_ * fVar7 + auVar55._0_4_ * fVar8;
              auVar53._4_4_ =
                   auVar49._4_4_ * fVar5 + fVar17 + auVar52._4_4_ * fVar6 + auVar54._4_4_ * fVar7 +
                   auVar55._4_4_ * fVar8;
              auVar53._8_4_ =
                   auVar49._8_4_ * fVar5 + fVar18 + auVar52._8_4_ * fVar6 + auVar54._8_4_ * fVar7 +
                   auVar55._8_4_ * fVar8;
              auVar53._12_4_ =
                   auVar49._12_4_ * fVar5 + fVar19 + auVar52._12_4_ * fVar6 + auVar54._12_4_ * fVar7
                   + auVar55._12_4_ * fVar8;
              fVar5 = auVar50._4_4_;
              fVar6 = auVar50._8_4_;
              fVar7 = auVar50._12_4_;
              auVar50._0_4_ =
                   auVar49._0_4_ * fVar9 + auVar50._0_4_ +
                   auVar52._0_4_ * fVar14 + auVar54._0_4_ * fVar15 + auVar55._0_4_ * fVar16;
              auVar50._4_4_ =
                   auVar49._4_4_ * fVar9 + fVar5 + auVar52._4_4_ * fVar14 + auVar54._4_4_ * fVar15 +
                   auVar55._4_4_ * fVar16;
              auVar50._8_4_ =
                   auVar49._8_4_ * fVar9 + fVar6 + auVar52._8_4_ * fVar14 + auVar54._8_4_ * fVar15 +
                   auVar55._8_4_ * fVar16;
              auVar50._12_4_ =
                   auVar49._12_4_ * fVar9 + fVar7 +
                   auVar52._12_4_ * fVar14 + auVar54._12_4_ * fVar15 + auVar55._12_4_ * fVar16;
              lVar45 = lVar45 + 0x20;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          *pauVar38 = auVar53;
          pauVar38[1] = auVar50;
          pauVar38 = pauVar38 + 2;
          uVar43 = iVar41 + 2;
          uVar44 = (ulong)uVar43;
          uVar34 = (uint)(byte)((char)uVar34 + 1);
          uVar35 = (ulong)uVar43;
        } while (iVar41 + 3 < (int)uVar21);
      }
      else {
        uVar44 = uVar35 & 0xffffffff;
      }
      if ((int)uVar44 < (int)uVar21) {
        do {
          uVar34 = (uint)uVar44;
          auVar51 = *pauVar40;
          if (0 < _h) {
            lVar42 = kernel->cstep * uVar47 * kernel->elemsize;
            pvVar13 = kernel->data;
            lVar36 = local_98.cstep *
                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) *
                     (ulong)((uVar34 & 1) + (int)(uVar44 >> 2) + (uint)((uVar34 >> 1 & 1) != 0));
            lVar45 = 0;
            iVar41 = _h;
            do {
              fVar5 = *(float *)((long)local_98.data + lVar45 + lVar36);
              fVar6 = *(float *)((long)local_98.data + lVar45 + lVar36 + 4);
              fVar7 = *(float *)((long)local_98.data + lVar45 + lVar36 + 8);
              fVar8 = *(float *)((long)local_98.data + lVar45 + lVar36 + 0xc);
              pfVar1 = (float *)((long)pvVar13 + lVar45 * 4 + lVar42);
              pfVar2 = (float *)((long)pvVar13 + lVar45 * 4 + lVar42 + 0x10);
              pfVar3 = (float *)((long)pvVar13 + lVar45 * 4 + lVar42 + 0x20);
              fVar9 = auVar51._4_4_;
              fVar14 = auVar51._8_4_;
              fVar15 = auVar51._12_4_;
              pfVar4 = (float *)((long)pvVar13 + lVar45 * 4 + lVar42 + 0x30);
              auVar51._0_4_ =
                   fVar5 * *pfVar1 + auVar51._0_4_ + fVar6 * *pfVar2 + fVar7 * *pfVar3 +
                   fVar8 * *pfVar4;
              auVar51._4_4_ =
                   fVar5 * pfVar1[1] + fVar9 + fVar6 * pfVar2[1] + fVar7 * pfVar3[1] +
                   fVar8 * pfVar4[1];
              auVar51._8_4_ =
                   fVar5 * pfVar1[2] + fVar14 + fVar6 * pfVar2[2] + fVar7 * pfVar3[2] +
                   fVar8 * pfVar4[2];
              auVar51._12_4_ =
                   fVar5 * pfVar1[3] + fVar15 + fVar6 * pfVar2[3] + fVar7 * pfVar3[3] +
                   fVar8 * pfVar4[3];
              lVar45 = lVar45 + 0x10;
              iVar41 = iVar41 + -1;
            } while (iVar41 != 0);
          }
          *pauVar38 = auVar51;
          pauVar38 = pauVar38 + 1;
          uVar44 = (ulong)(uVar34 + 1);
        } while (uVar34 + 1 != uVar21);
      }
      uVar47 = uVar47 + 1;
    } while (uVar47 != uVar11);
  }
  piVar33 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar33 != (int *)0x0) {
    LOCK();
    *piVar33 = *piVar33 + -1;
    UNLOCK();
    if (*piVar33 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s1_sgemm_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    int outch = top_blob.c;

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int size = w * h;

    const float* bias = _bias;

    // interleave
    Mat tmp(4, inch, size / 4 + (size % 4) / 2 + size % 2, elemsize, elempack, opt.workspace_allocator);
    {
        int nn_size;
        int remain_size_start;

        remain_size_start = 0;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            const float* img0 = bottom_blob.channel(0);
            img0 += i * 4;

            float* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                __m128 _r0 = _mm_loadu_ps(img0);
                __m128 _r1 = _mm_loadu_ps(img0 + 4);
                __m128 _r2 = _mm_loadu_ps(img0 + 8);
                __m128 _r3 = _mm_loadu_ps(img0 + 12);
                _mm_storeu_ps(tmpptr, _r0);
                _mm_storeu_ps(tmpptr + 4, _r1);
                _mm_storeu_ps(tmpptr + 8, _r2);
                _mm_storeu_ps(tmpptr + 12, _r3);

                tmpptr += 16;
                img0 += bottom_blob.cstep * 4;
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

            const float* img0 = bottom_blob.channel(0);
            img0 += i * 4;

            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);

            for (int q = 0; q < inch; q++)
            {
                __m128 _r0 = _mm_loadu_ps(img0);
                __m128 _r1 = _mm_loadu_ps(img0 + 4);
                _mm_storeu_ps(tmpptr, _r0);
                _mm_storeu_ps(tmpptr + 4, _r1);

                tmpptr += 8;
                img0 += bottom_blob.cstep * 4;
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            const float* img0 = bottom_blob.channel(0);
            img0 += i * 4;

            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);

            for (int q = 0; q < inch; q++)
            {
                __m128 _r0 = _mm_loadu_ps(img0);
                _mm_storeu_ps(tmpptr, _r0);

                tmpptr += 4;
                img0 += bottom_blob.cstep * 4;
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 4);
            const float* kptr0 = (const float*)kernel.channel(p);

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _mm_loadu_ps(biasptr);
            __m128 _sum2 = _mm_loadu_ps(biasptr);
            __m128 _sum3 = _mm_loadu_ps(biasptr);

            for (int q = 0; q < inch; q++)
            {
                __m128 _val00 = _mm_load1_ps(tmpptr);
                __m128 _val01 = _mm_load1_ps(tmpptr + 1);
                __m128 _val02 = _mm_load1_ps(tmpptr + 2);
                __m128 _val03 = _mm_load1_ps(tmpptr + 3);
                __m128 _val10 = _mm_load1_ps(tmpptr + 4);
                __m128 _val11 = _mm_load1_ps(tmpptr + 5);
                __m128 _val12 = _mm_load1_ps(tmpptr + 6);
                __m128 _val13 = _mm_load1_ps(tmpptr + 7);
                __m128 _val20 = _mm_load1_ps(tmpptr + 8);
                __m128 _val21 = _mm_load1_ps(tmpptr + 9);
                __m128 _val22 = _mm_load1_ps(tmpptr + 10);
                __m128 _val23 = _mm_load1_ps(tmpptr + 11);
                __m128 _val30 = _mm_load1_ps(tmpptr + 12);
                __m128 _val31 = _mm_load1_ps(tmpptr + 13);
                __m128 _val32 = _mm_load1_ps(tmpptr + 14);
                __m128 _val33 = _mm_load1_ps(tmpptr + 15);

                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _w1 = _mm_load_ps(kptr0 + 4);
                __m128 _w2 = _mm_load_ps(kptr0 + 8);
                __m128 _w3 = _mm_load_ps(kptr0 + 12);

                _sum0 = _mm_comp_fmadd_ps(_w0, _val00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w1, _val01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w2, _val02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w3, _val03, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val10, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w1, _val11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w2, _val12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w3, _val13, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_w0, _val20, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_w1, _val21, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_w2, _val22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_w3, _val23, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_w0, _val30, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_w1, _val31, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_w2, _val32, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_w3, _val33, _sum3);

                tmpptr += 16;
                kptr0 += 16;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            outptr0 += 16;
        }
        for (; i + 1 < size; i += 2)
        {
            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
            const float* kptr0 = (const float*)kernel.channel(p);

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _mm_loadu_ps(biasptr);

            for (int q = 0; q < inch; q++)
            {
                __m128 _val00 = _mm_load1_ps(tmpptr);
                __m128 _val01 = _mm_load1_ps(tmpptr + 1);
                __m128 _val02 = _mm_load1_ps(tmpptr + 2);
                __m128 _val03 = _mm_load1_ps(tmpptr + 3);
                __m128 _val10 = _mm_load1_ps(tmpptr + 4);
                __m128 _val11 = _mm_load1_ps(tmpptr + 5);
                __m128 _val12 = _mm_load1_ps(tmpptr + 6);
                __m128 _val13 = _mm_load1_ps(tmpptr + 7);

                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _w1 = _mm_load_ps(kptr0 + 4);
                __m128 _w2 = _mm_load_ps(kptr0 + 8);
                __m128 _w3 = _mm_load_ps(kptr0 + 12);

                _sum0 = _mm_comp_fmadd_ps(_w0, _val00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w1, _val01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w2, _val02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w3, _val03, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val10, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w1, _val11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w2, _val12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w3, _val13, _sum1);

                tmpptr += 8;
                kptr0 += 16;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
            const float* kptr0 = (const float*)kernel.channel(p);

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int q = 0; q < inch; q++)
            {
                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);

                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _w1 = _mm_load_ps(kptr0 + 4);
                __m128 _w2 = _mm_load_ps(kptr0 + 8);
                __m128 _w3 = _mm_load_ps(kptr0 + 12);

                _sum = _mm_comp_fmadd_ps(_w0, _val0, _sum);
                _sum = _mm_comp_fmadd_ps(_w1, _val1, _sum);
                _sum = _mm_comp_fmadd_ps(_w2, _val2, _sum);
                _sum = _mm_comp_fmadd_ps(_w3, _val3, _sum);

                tmpptr += 4;
                kptr0 += 16;
            }

            _mm_store_ps(outptr0, _sum);
            outptr0 += 4;
        }
    }

    //     // NOTE sgemm
    //     for (; p<outch; p++)
    //     {
    //         Mat out0 = top_blob.channel(p);
    //
    //         const float bias0 = bias ? bias[p] : 0.f;
    //
    //         float* outptr0 = out0;
    //
    //         for (int i=0; i<size; i++)
    //         {
    //             float sum = bias0;
    //
    //             const float* kptr = _kernel.channel(p);
    //
    //             for (int q=0; q<inch; q++)
    //             {
    //                 const float* img0 = bottom_blob.channel(q);
    //
    //                 sum += img0[i] * kptr[0];
    //                 kptr ++;
    //             }
    //
    //             outptr0[i] = sum;
    //         }
    //     }
}